

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptimeutilities.h
# Opt level: O0

void __thiscall jrtplib::RTPTime::RTPTime(RTPTime *this,int64_t seconds,uint32_t microseconds)

{
  int64_t possec;
  uint32_t microseconds_local;
  int64_t seconds_local;
  RTPTime *this_local;
  
  if (seconds < 0) {
    this->m_t = (double)microseconds * 1e-06 + (double)-seconds;
    this->m_t = -this->m_t;
  }
  else {
    this->m_t = (double)microseconds * 1e-06 + (double)seconds;
  }
  return;
}

Assistant:

inline RTPTime::RTPTime(int64_t seconds, uint32_t microseconds)
{
	if (seconds >= 0)
	{
		m_t = (double)seconds + 1e-6*(double)microseconds;
	}
	else
	{
		int64_t possec = -seconds;

		m_t = (double)possec + 1e-6*(double)microseconds;
		m_t = -m_t;
	}
}